

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_delete.cpp
# Opt level: O1

BoundStatement * __thiscall
duckdb::Binder::Bind(BoundStatement *__return_storage_ptr__,Binder *this,DeleteStatement *stmt)

{
  unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true> *this_00;
  BoundStatement result;
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> uVar1;
  templated_unique_single_t tVar2;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> uVar3;
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> uVar4;
  unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true> uVar5;
  optional_ptr<duckdb::Binder,_true> this_01;
  _Head_base<0UL,_duckdb::LogicalDelete_*,_false> _Var6;
  __node_base _Var7;
  __node_base table;
  element_type *peVar8;
  pointer pBVar9;
  BoundBaseTableRef *pBVar10;
  pointer this_02;
  LogicalGet *pLVar11;
  StatementProperties *pSVar12;
  Binder *pBVar13;
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_> this_03;
  pointer this_04;
  idx_t iVar14;
  unique_ptr<duckdb::LogicalDelete,_std::default_delete<duckdb::LogicalDelete>_> this_05;
  pointer pLVar15;
  pointer pTVar16;
  BinderException *this_06;
  case_insensitive_map_t<shared_ptr<Binding>_> *pcVar17;
  Binder *this_07;
  _Hash_node_base *p_Var18;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<duckdb::LogicalType> __l_00;
  undefined8 uStack_308;
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> root;
  undefined8 uStack_2f8;
  templated_unique_single_t del;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> condition;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_2e0;
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> op;
  __weak_count<(__gnu_cxx::_Lock_policy)2> _Stack_2d0;
  __node_base local_2c8;
  unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true> bound_table;
  unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true> bound_node;
  __node_base _Stack_2b0;
  ClientContext *local_2a8;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_298;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_290;
  optional_ptr<duckdb::Binder,_true> local_288;
  unique_ptr<duckdb::LogicalDelete,_std::default_delete<duckdb::LogicalDelete>_> local_280;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_278;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_270;
  __node_base local_268;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_260;
  _Head_base<0UL,_duckdb::LogicalDelete_*,_false> local_258;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> vStack_250;
  __uniq_ptr_impl<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_> local_238;
  Binder *pBStack_230;
  __node_base local_228;
  Binder *local_218;
  __node_base local_210;
  LogicalGet *local_208;
  __node_base local_200;
  Binder *local_1f8;
  BindContext *local_1f0;
  __node_base local_1e8;
  _Hash_node_base *local_1e0;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  local_1d8;
  shared_ptr<duckdb::Binder,_true> using_binder;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8 [6];
  __node_base local_148;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_140;
  _Alloc_hider local_130;
  undefined1 local_128 [24];
  BindContext local_110;
  
  local_238._M_t.
  super__Tuple_impl<0UL,_duckdb::BoundTableRef_*,_std::default_delete<duckdb::BoundTableRef>_>.
  super__Head_base<0UL,_duckdb::BoundTableRef_*,_false>._M_head_impl =
       (tuple<duckdb::BoundTableRef_*,_std::default_delete<duckdb::BoundTableRef>_>)
       (_Tuple_impl<0UL,_duckdb::BoundTableRef_*,_std::default_delete<duckdb::BoundTableRef>_>)0x0;
  pBStack_230 = (Binder *)0x0;
  vStack_250.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_250.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_258._M_head_impl = (LogicalDelete *)0x0;
  vStack_250.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_228._M_nxt = (_Hash_node_base *)0x0;
  this_00 = &stmt->table;
  unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>::operator*(this_00);
  Bind((Binder *)&bound_table,(TableRef *)this);
  pBVar9 = unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true>::
           operator->(&bound_table);
  if (pBVar9->type == BASE_TABLE) {
    pBVar9 = unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true>::
             operator->(&bound_table);
    pBVar10 = BoundTableRef::Cast<duckdb::BoundBaseTableRef>(pBVar9);
    pBVar13 = (Binder *)pBVar10->table;
    unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true>::operator*
              (&bound_table);
    CreatePlan((Binder *)&root,(BoundTableRef *)this);
    this_02 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
              ::operator->(&root);
    pLVar11 = LogicalOperator::Cast<duckdb::LogicalGet>(this_02);
    if (*(char *)((long)&(pBVar13->CTE_bindings)._M_h._M_rehash_policy._M_next_resize + 1) == '\0')
    {
      pSVar12 = GetStatementProperties(this);
      StatementProperties::RegisterDBModify
                (pSVar12,(Catalog *)
                         (pBVar13->bind_context).bindings_list.
                         super_vector<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
                         .
                         super__Vector_base<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,this->context);
    }
    AddCTEMap(this,&stmt->cte_map);
    p_Var18 = (_Hash_node_base *)
              (stmt->using_clauses).
              super_vector<duckdb::unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_1e8._M_nxt =
         (_Hash_node_base *)
         (stmt->using_clauses).
         super_vector<duckdb::unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>_>_>
         .
         super__Vector_base<duckdb::unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_288.ptr = this;
    local_210._M_nxt = (_Hash_node_base *)this_00;
    local_208 = pLVar11;
    local_200._M_nxt = (_Hash_node_base *)pBVar13;
    local_1f8 = (Binder *)stmt;
    if (p_Var18 != local_1e8._M_nxt) {
      local_1f0 = &this->bind_context;
      local_2e0._M_head_impl = (Expression *)0x0;
      local_218 = (Binder *)__return_storage_ptr__;
      do {
        CreateBinder((Binder *)&using_binder,(local_288.ptr)->context,local_288,REGULAR_BINDER);
        pBVar13 = shared_ptr<duckdb::Binder,_true>::operator->(&using_binder);
        unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>::operator*
                  ((unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true> *)
                   p_Var18);
        Bind((Binder *)&bound_node,(TableRef *)pBVar13);
        unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true>::
        operator*(&bound_node);
        CreatePlan((Binder *)&op,(BoundTableRef *)local_288.ptr);
        if ((_Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)
            local_2e0._M_head_impl == (Expression *)0x0) {
          local_2e0._M_head_impl =
               (Expression *)
               op.
               super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
               ._M_t.
               super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
               .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
          op.
          super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
          _M_t.
          super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
          .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
               (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
               (__uniq_ptr_data<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true,_true>
                )0x0;
        }
        else {
          local_290._M_head_impl = local_2e0._M_head_impl;
          local_298._M_head_impl =
               (LogicalOperator *)
               op.
               super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
               ._M_t.
               super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
               .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
          op.
          super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
          _M_t.
          super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
          .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
               (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
               (__uniq_ptr_data<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true,_true>
                )0x0;
          LogicalCrossProduct::Create
                    ((LogicalCrossProduct *)&condition,
                     (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                      *)&local_290,
                     (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                      *)&local_298);
          local_2e0._M_head_impl =
               (Expression *)
               condition.
               super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
               super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
               _M_t.
               super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
               .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
          condition.super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
          _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
          _M_t.
          super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
          super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
               (__uniq_ptr_data<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true,_true>
                )0x0;
          if ((_Head_base<0UL,_duckdb::LogicalOperator_*,_false>)local_298._M_head_impl !=
              (_Head_base<0UL,_duckdb::LogicalOperator_*,_false>)0x0) {
            (*(local_298._M_head_impl)->_vptr_LogicalOperator[1])();
          }
          local_298._M_head_impl = (LogicalOperator *)0x0;
          if (local_290._M_head_impl != (Expression *)0x0) {
            (*((local_290._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
          }
          local_290._M_head_impl = (Expression *)0x0;
        }
        local_1e0 = p_Var18;
        pBVar13 = shared_ptr<duckdb::Binder,_true>::operator->(&using_binder);
        ::std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<unsigned_long,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<unsigned_long,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<unsigned_long,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<unsigned_long,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      *)&local_110,&pBVar13->bind_context);
        local_110.binder = (pBVar13->bind_context).binder;
        local_110.bindings_list.
        super_vector<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pBVar13->bind_context).bindings_list.
             super_vector<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_110.bindings_list.
        super_vector<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             (pBVar13->bind_context).bindings_list.
             super_vector<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_110.bindings_list.
        super_vector<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pBVar13->bind_context).bindings_list.
             super_vector<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        (pBVar13->bind_context).bindings_list.
        super_vector<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        (pBVar13->bind_context).bindings_list.
        super_vector<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (pBVar13->bind_context).bindings_list.
        super_vector<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        ::std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<std::reference_wrapper<duckdb::UsingColumnSet>,_duckdb::ReferenceHashFunction<duckdb::UsingColumnSet>,_duckdb::ReferenceEquality<duckdb::UsingColumnSet>,_std::allocator<std::reference_wrapper<duckdb::UsingColumnSet>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<std::reference_wrapper<duckdb::UsingColumnSet>,_duckdb::ReferenceHashFunction<duckdb::UsingColumnSet>,_duckdb::ReferenceEquality<duckdb::UsingColumnSet>,_std::allocator<std::reference_wrapper<duckdb::UsingColumnSet>_>_>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::_Hashtable(&local_110.using_columns._M_h,&(pBVar13->bind_context).using_columns);
        local_110.using_column_sets.
        super_vector<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pBVar13->bind_context).using_column_sets.
             super_vector<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_110.using_column_sets.
        super_vector<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             (pBVar13->bind_context).using_column_sets.
             super_vector<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_110.using_column_sets.
        super_vector<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pBVar13->bind_context).using_column_sets.
             super_vector<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        (pBVar13->bind_context).using_column_sets.
        super_vector<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        (pBVar13->bind_context).using_column_sets.
        super_vector<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (pBVar13->bind_context).using_column_sets.
        super_vector<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        pcVar17 = &(pBVar13->bind_context).cte_bindings;
        ::std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::Binding,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::Binding,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::_Hashtable(&local_110.cte_bindings._M_h,pcVar17,pcVar17);
        BindContext::AddContext(local_1f0,&local_110);
        ::std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::Binding,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::Binding,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::~_Hashtable(&local_110.cte_bindings._M_h);
        ::std::
        vector<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>_>_>
        ::~vector(&local_110.using_column_sets.
                   super_vector<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>_>_>
                 );
        ::std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<std::reference_wrapper<duckdb::UsingColumnSet>,_duckdb::ReferenceHashFunction<duckdb::UsingColumnSet>,_duckdb::ReferenceEquality<duckdb::UsingColumnSet>,_std::allocator<std::reference_wrapper<duckdb::UsingColumnSet>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<std::reference_wrapper<duckdb::UsingColumnSet>,_duckdb::ReferenceHashFunction<duckdb::UsingColumnSet>,_duckdb::ReferenceEquality<duckdb::UsingColumnSet>,_std::allocator<std::reference_wrapper<duckdb::UsingColumnSet>_>_>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::~_Hashtable(&local_110.using_columns._M_h);
        ::std::
        vector<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
        ::~vector(&local_110.bindings_list.
                   super_vector<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
                 );
        ::std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<unsigned_long,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<unsigned_long,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<unsigned_long,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<unsigned_long,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       *)&local_110);
        if (op.
            super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
            ._M_t.
            super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
            .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl !=
            (__uniq_ptr_data<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true,_true>
             )0x0) {
          (**(code **)(*(long *)op.
                                super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                                ._M_t.
                                super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                                .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>.
                                _M_head_impl + 8))();
        }
        p_Var18 = local_1e0;
        if (bound_node.
            super_unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_>.
            _M_t.
            super___uniq_ptr_impl<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::BoundTableRef_*,_std::default_delete<duckdb::BoundTableRef>_>
            .super__Head_base<0UL,_duckdb::BoundTableRef_*,_false>._M_head_impl !=
            (__uniq_ptr_data<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true,_true>
             )0x0) {
          (**(code **)(*(long *)bound_node.
                                super_unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_>
                                ._M_t.
                                super___uniq_ptr_impl<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_duckdb::BoundTableRef_*,_std::default_delete<duckdb::BoundTableRef>_>
                                .super__Head_base<0UL,_duckdb::BoundTableRef_*,_false>._M_head_impl
                      + 8))();
        }
        if (using_binder.internal.super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (using_binder.internal.
                     super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi);
        }
        p_Var18 = p_Var18 + 1;
      } while (p_Var18 != local_1e8._M_nxt);
      __return_storage_ptr__ = (BoundStatement *)local_218;
      if ((_Head_base<0UL,_duckdb::Expression_*,_false>)local_2e0._M_head_impl !=
          (_Head_base<0UL,_duckdb::Expression_*,_false>)0x0) {
        local_260._M_head_impl =
             (LogicalOperator *)
             root.
             super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
             ._M_t.
             super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
             .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
        root.
        super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
        _M_t.
        super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
        .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
             (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
             (__uniq_ptr_data<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true,_true>
              )0x0;
        local_268._M_nxt = (_Hash_node_base *)local_2e0._M_head_impl;
        LogicalCrossProduct::Create
                  ((LogicalCrossProduct *)&using_binder,
                   (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                    *)&local_260,
                   (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                    *)&local_268);
        peVar8 = using_binder.internal.
                 super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        __return_storage_ptr__ = (BoundStatement *)local_218;
        uVar1 = root;
        using_binder.internal.super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             = (element_type *)0x0;
        root.
        super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
        _M_t.
        super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
        .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
             (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
             (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
             peVar8;
        if (uVar1.
            super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
            ._M_t.
            super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
            .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl !=
            (__uniq_ptr_data<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true,_true>
             )0x0) {
          (**(code **)(*(long *)uVar1.
                                super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                                ._M_t.
                                super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                                .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>.
                                _M_head_impl + 8))();
        }
        if (using_binder.internal.super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr != (element_type *)0x0) {
          (*(code *)((((using_binder.internal.
                        super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                      super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                      super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                    super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                    super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
                    ();
        }
        using_binder.internal.super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             = (element_type *)0x0;
        if ((Expression *)local_268._M_nxt != (Expression *)0x0) {
          (*((BaseExpression *)&(local_268._M_nxt)->_M_nxt)->_vptr_BaseExpression[1])();
        }
        local_268._M_nxt = (_Hash_node_base *)0x0;
        if (local_260._M_head_impl != (LogicalOperator *)0x0) {
          (*(code *)((_Hash_node_base *)(local_260._M_head_impl)->_vptr_LogicalOperator)[1]._M_nxt)
                    ();
        }
        local_260._M_head_impl = (LogicalOperator *)0x0;
      }
    }
    pBVar13 = local_1f8;
    table._M_nxt = local_200._M_nxt;
    this_01.ptr = local_288.ptr;
    condition.super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (__uniq_ptr_data<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true,_true>)
         0x0;
    if ((local_1f8->bound_ctes)._M_h._M_rehash_policy._M_next_resize != 0) {
      WhereBinder::WhereBinder
                ((WhereBinder *)&using_binder,local_288.ptr,(local_288.ptr)->context,
                 (optional_ptr<duckdb::ColumnAliasBinder,_true>)0x0);
      ExpressionBinder::Bind
                ((ExpressionBinder *)&bound_node,
                 (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)&using_binder,
                 (optional_ptr<duckdb::LogicalType,_true>)
                 &(pBVar13->bound_ctes)._M_h._M_rehash_policy._M_next_resize,false);
      uVar5 = bound_node;
      uVar3 = condition;
      bound_node.
      super_unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_>._M_t.
      super___uniq_ptr_impl<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_>._M_t
      .super__Tuple_impl<0UL,_duckdb::BoundTableRef_*,_std::default_delete<duckdb::BoundTableRef>_>.
      super__Head_base<0UL,_duckdb::BoundTableRef_*,_false>._M_head_impl =
           (unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_>)
           (__uniq_ptr_data<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true,_true>
            )0x0;
      condition.super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
      super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
      super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
           (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
           (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
           uVar5.
           super_unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_>._M_t
           .
           super___uniq_ptr_impl<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::BoundTableRef_*,_std::default_delete<duckdb::BoundTableRef>_>
           .super__Head_base<0UL,_duckdb::BoundTableRef_*,_false>._M_head_impl;
      if (uVar3.super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
          super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
          super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
          super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl !=
          (__uniq_ptr_data<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true,_true>)
          0x0) {
        (**(code **)(*(long *)uVar3.
                              super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                              ._M_t.
                              super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                              .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl + 8))
                  ();
      }
      if (bound_node.
          super_unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_>._M_t.
          super___uniq_ptr_impl<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_>.
          _M_t.
          super__Tuple_impl<0UL,_duckdb::BoundTableRef_*,_std::default_delete<duckdb::BoundTableRef>_>
          .super__Head_base<0UL,_duckdb::BoundTableRef_*,_false>._M_head_impl !=
          (__uniq_ptr_data<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true,_true>
           )0x0) {
        (**(code **)(*(long *)bound_node.
                              super_unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_>
                              ._M_t.
                              super___uniq_ptr_impl<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_duckdb::BoundTableRef_*,_std::default_delete<duckdb::BoundTableRef>_>
                              .super__Head_base<0UL,_duckdb::BoundTableRef_*,_false>._M_head_impl +
                    8))();
      }
      PlanSubqueries(this_01.ptr,&condition,&root);
      this_03._M_t.
      super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
      .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
           (__uniq_ptr_data<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true,_true>
            )operator_new(0x80);
      bound_node.
      super_unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_>._M_t.
      super___uniq_ptr_impl<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_>._M_t
      .super__Tuple_impl<0UL,_duckdb::BoundTableRef_*,_std::default_delete<duckdb::BoundTableRef>_>.
      super__Head_base<0UL,_duckdb::BoundTableRef_*,_false>._M_head_impl =
           (unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_>)
           (unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_>)
           condition.super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
           _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
           _M_t.
           super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
           super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
      condition.super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
      super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
      super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
           (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
           (__uniq_ptr_data<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true,_true>
           )0x0;
      LogicalFilter::LogicalFilter
                ((LogicalFilter *)
                 this_03._M_t.
                 super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                 .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 &bound_node);
      op.super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
      _M_t.
      super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
      .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
           (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
           (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
           this_03._M_t.
           super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
           .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
      if (bound_node.
          super_unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_>._M_t.
          super___uniq_ptr_impl<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_>.
          _M_t.
          super__Tuple_impl<0UL,_duckdb::BoundTableRef_*,_std::default_delete<duckdb::BoundTableRef>_>
          .super__Head_base<0UL,_duckdb::BoundTableRef_*,_false>._M_head_impl !=
          (__uniq_ptr_data<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true,_true>
           )0x0) {
        (**(code **)(*(long *)bound_node.
                              super_unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_>
                              ._M_t.
                              super___uniq_ptr_impl<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_duckdb::BoundTableRef_*,_std::default_delete<duckdb::BoundTableRef>_>
                              .super__Head_base<0UL,_duckdb::BoundTableRef_*,_false>._M_head_impl +
                    8))();
      }
      this_04 = unique_ptr<duckdb::LogicalFilter,_std::default_delete<duckdb::LogicalFilter>,_true>
                ::operator->((unique_ptr<duckdb::LogicalFilter,_std::default_delete<duckdb::LogicalFilter>,_true>
                              *)&op);
      local_270._M_head_impl =
           (LogicalOperator *)
           root.
           super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
           _M_t.
           super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
           .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
      root.super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
      _M_t.
      super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
      .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
           (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
           (__uniq_ptr_data<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true,_true>
            )0x0;
      LogicalOperator::AddChild
                (&this_04->super_LogicalOperator,
                 (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                  *)&local_270);
      if ((_Head_base<0UL,_duckdb::LogicalOperator_*,_false>)local_270._M_head_impl !=
          (_Head_base<0UL,_duckdb::LogicalOperator_*,_false>)0x0) {
        (*(local_270._M_head_impl)->_vptr_LogicalOperator[1])();
      }
      uVar4.super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
      .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
           op.
           super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
           _M_t.
           super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
           .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
      uVar1.super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
      .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
           root.
           super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
           _M_t.
           super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
           .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
      local_270._M_head_impl = (LogicalOperator *)0x0;
      op.super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
      _M_t.
      super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
      .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
           (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
           (__uniq_ptr_data<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true,_true>
            )0x0;
      root = uVar4;
      if (uVar1.
          super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
          _M_t.
          super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
          .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl !=
          (__uniq_ptr_data<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true,_true>
           )0x0) {
        (**(code **)(*(long *)uVar1.
                              super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                              ._M_t.
                              super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                              .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl
                    + 8))();
      }
      if (op.
          super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
          _M_t.
          super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
          .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl !=
          (__uniq_ptr_data<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true,_true>
           )0x0) {
        (**(code **)(*(long *)op.
                              super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                              ._M_t.
                              super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                              .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl
                    + 8))();
      }
      ExpressionBinder::~ExpressionBinder((ExpressionBinder *)&using_binder);
    }
    iVar14 = GenerateTableIndex(this_01.ptr);
    this_05._M_t.
    super___uniq_ptr_impl<duckdb::LogicalDelete,_std::default_delete<duckdb::LogicalDelete>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::LogicalDelete_*,_std::default_delete<duckdb::LogicalDelete>_>.
    super__Head_base<0UL,_duckdb::LogicalDelete_*,_false>._M_head_impl =
         (__uniq_ptr_data<duckdb::LogicalDelete,_std::default_delete<duckdb::LogicalDelete>,_true,_true>
          )operator_new(0x98);
    LogicalDelete::LogicalDelete
              ((LogicalDelete *)
               this_05._M_t.
               super___uniq_ptr_impl<duckdb::LogicalDelete,_std::default_delete<duckdb::LogicalDelete>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::LogicalDelete_*,_std::default_delete<duckdb::LogicalDelete>_>
               .super__Head_base<0UL,_duckdb::LogicalDelete_*,_false>._M_head_impl,
               (TableCatalogEntry *)table._M_nxt,iVar14);
    del.super_unique_ptr<duckdb::LogicalDelete,_std::default_delete<duckdb::LogicalDelete>_>._M_t.
    super___uniq_ptr_impl<duckdb::LogicalDelete,_std::default_delete<duckdb::LogicalDelete>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::LogicalDelete_*,_std::default_delete<duckdb::LogicalDelete>_>.
    super__Head_base<0UL,_duckdb::LogicalDelete_*,_false>._M_head_impl =
         (unique_ptr<duckdb::LogicalDelete,_std::default_delete<duckdb::LogicalDelete>_>)
         (unique_ptr<duckdb::LogicalDelete,_std::default_delete<duckdb::LogicalDelete>_>)
         this_05._M_t.
         super___uniq_ptr_impl<duckdb::LogicalDelete,_std::default_delete<duckdb::LogicalDelete>_>.
         _M_t.
         super__Tuple_impl<0UL,_duckdb::LogicalDelete_*,_std::default_delete<duckdb::LogicalDelete>_>
         .super__Head_base<0UL,_duckdb::LogicalDelete_*,_false>._M_head_impl;
    BindConstraints((vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_true>
                     *)&bound_node,this_01.ptr,(TableCatalogEntry *)table._M_nxt);
    pLVar15 = unique_ptr<duckdb::LogicalDelete,_std::default_delete<duckdb::LogicalDelete>,_true>::
              operator->(&del);
    using_binder.internal.super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         (pLVar15->bound_constraints).
         super_vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
         .
         super__Vector_base<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    using_binder.internal.super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount
    ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             (pLVar15->bound_constraints).
             super_vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_1a8[0]._0_8_ =
         (pLVar15->bound_constraints).
         super_vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
         .
         super__Vector_base<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (pLVar15->bound_constraints).
    super_vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)bound_node.
                  super_unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_>
                  ._M_t.
                  super___uniq_ptr_impl<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_duckdb::BoundTableRef_*,_std::default_delete<duckdb::BoundTableRef>_>
                  .super__Head_base<0UL,_duckdb::BoundTableRef_*,_false>._M_head_impl;
    (pLVar15->bound_constraints).
    super_vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)_Stack_2b0._M_nxt;
    (pLVar15->bound_constraints).
    super_vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_2a8;
    bound_node.super_unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_>.
    _M_t.super___uniq_ptr_impl<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::BoundTableRef_*,_std::default_delete<duckdb::BoundTableRef>_>.
    super__Head_base<0UL,_duckdb::BoundTableRef_*,_false>._M_head_impl =
         (unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_>)
         (__uniq_ptr_data<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true,_true>
          )0x0;
    ::std::
    vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
    ::~vector((vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
               *)&using_binder);
    ::std::
    vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
    ::~vector((vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
               *)&bound_node);
    pLVar15 = unique_ptr<duckdb::LogicalDelete,_std::default_delete<duckdb::LogicalDelete>,_true>::
              operator->(&del);
    local_278._M_head_impl =
         (LogicalOperator *)
         root.
         super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
         .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
    root.super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
    _M_t.
    super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
    .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
         (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
         (__uniq_ptr_data<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true,_true>
          )0x0;
    LogicalOperator::AddChild
              (&pLVar15->super_LogicalOperator,
               (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                *)&local_278);
    if ((_Head_base<0UL,_duckdb::LogicalOperator_*,_false>)local_278._M_head_impl !=
        (_Head_base<0UL,_duckdb::LogicalOperator_*,_false>)0x0) {
      (*(local_278._M_head_impl)->_vptr_LogicalOperator[1])();
    }
    local_278._M_head_impl = (LogicalOperator *)0x0;
    this_07 = (Binder *)&del;
    pLVar15 = unique_ptr<duckdb::LogicalDelete,_std::default_delete<duckdb::LogicalDelete>,_true>::
              operator->((unique_ptr<duckdb::LogicalDelete,_std::default_delete<duckdb::LogicalDelete>,_true>
                          *)this_07);
    BindRowIdColumns(this_07,(TableCatalogEntry *)table._M_nxt,local_208,
                     &(pLVar15->super_LogicalOperator).expressions);
    _Var6._M_head_impl = local_258._M_head_impl;
    tVar2 = del;
    if ((pBVar13->bind_context).cte_references._M_h._M_element_count ==
        *(size_type *)&(pBVar13->bind_context).cte_references._M_h._M_rehash_policy) {
      del.super_unique_ptr<duckdb::LogicalDelete,_std::default_delete<duckdb::LogicalDelete>_>._M_t.
      super___uniq_ptr_impl<duckdb::LogicalDelete,_std::default_delete<duckdb::LogicalDelete>_>._M_t
      .super__Tuple_impl<0UL,_duckdb::LogicalDelete_*,_std::default_delete<duckdb::LogicalDelete>_>.
      super__Head_base<0UL,_duckdb::LogicalDelete_*,_false>._M_head_impl =
           (unique_ptr<duckdb::LogicalDelete,_std::default_delete<duckdb::LogicalDelete>_>)
           (__uniq_ptr_data<duckdb::LogicalDelete,_std::default_delete<duckdb::LogicalDelete>,_true,_true>
            )0x0;
      local_258._M_head_impl =
           (LogicalDelete *)
           tVar2.
           super_unique_ptr<duckdb::LogicalDelete,_std::default_delete<duckdb::LogicalDelete>_>._M_t
           .
           super___uniq_ptr_impl<duckdb::LogicalDelete,_std::default_delete<duckdb::LogicalDelete>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::LogicalDelete_*,_std::default_delete<duckdb::LogicalDelete>_>
           .super__Head_base<0UL,_duckdb::LogicalDelete_*,_false>._M_head_impl;
      if (_Var6._M_head_impl != (LogicalDelete *)0x0) {
        (**(code **)(((ColumnBinding *)&(_Var6._M_head_impl)->super_LogicalOperator)->table_index +
                    8))();
      }
      using_binder.internal.super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_1a8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&using_binder,"Count","");
      __l._M_len = 1;
      __l._M_array = (iterator)&using_binder;
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&op,__l,(allocator_type *)((long)&uStack_2f8 + 7));
      _Var7._M_nxt = local_228._M_nxt;
      pBVar13 = pBStack_230;
      bound_node.
      super_unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_>._M_t.
      super___uniq_ptr_impl<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_>._M_t
      .super__Tuple_impl<0UL,_duckdb::BoundTableRef_*,_std::default_delete<duckdb::BoundTableRef>_>.
      super__Head_base<0UL,_duckdb::BoundTableRef_*,_false>._M_head_impl =
           (unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_>)
           (unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_>)
           local_238._M_t.
           super__Tuple_impl<0UL,_duckdb::BoundTableRef_*,_std::default_delete<duckdb::BoundTableRef>_>
           .super__Head_base<0UL,_duckdb::BoundTableRef_*,_false>._M_head_impl;
      local_238._M_t.
      super__Tuple_impl<0UL,_duckdb::BoundTableRef_*,_std::default_delete<duckdb::BoundTableRef>_>.
      super__Head_base<0UL,_duckdb::BoundTableRef_*,_false>._M_head_impl =
           (tuple<duckdb::BoundTableRef_*,_std::default_delete<duckdb::BoundTableRef>_>)
           (tuple<duckdb::BoundTableRef_*,_std::default_delete<duckdb::BoundTableRef>_>)
           op.
           super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
           _M_t.
           super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
           .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
      pBStack_230 = (Binder *)_Stack_2d0._M_pi;
      local_228._M_nxt = local_2c8._M_nxt;
      op.super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
      _M_t.
      super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
      .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
           (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
           (__uniq_ptr_data<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true,_true>
            )0x0;
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&bound_node);
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&op);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)using_binder.internal.super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr != local_1a8) {
        operator_delete(using_binder.internal.
                        super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      }
      LogicalType::LogicalType((LogicalType *)&op,BIGINT);
      __l_00._M_len = 1;
      __l_00._M_array = (iterator)&op;
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&bound_node,
                 __l_00,(allocator_type *)((long)&uStack_2f8 + 7));
      local_1a8[0]._0_8_ =
           vStack_250.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
      using_binder.internal.super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           vStack_250.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      using_binder.internal.super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           vStack_250.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
           _M_impl.super__Vector_impl_data._M_start;
      vStack_250.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      _M_impl.super__Vector_impl_data._M_start =
           (pointer)bound_node.
                    super_unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_>
                    ._M_t.
                    super___uniq_ptr_impl<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_duckdb::BoundTableRef_*,_std::default_delete<duckdb::BoundTableRef>_>
                    .super__Head_base<0UL,_duckdb::BoundTableRef_*,_false>._M_head_impl;
      vStack_250.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)pBVar13;
      vStack_250.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)_Var7._M_nxt;
      bound_node.
      super_unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_>._M_t.
      super___uniq_ptr_impl<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_>._M_t
      .super__Tuple_impl<0UL,_duckdb::BoundTableRef_*,_std::default_delete<duckdb::BoundTableRef>_>.
      super__Head_base<0UL,_duckdb::BoundTableRef_*,_false>._M_head_impl =
           (unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_>)
           (__uniq_ptr_data<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true,_true>
            )0x0;
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&using_binder)
      ;
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&bound_node);
      LogicalType::~LogicalType((LogicalType *)&op);
      pSVar12 = GetStatementProperties(this_01.ptr);
      pSVar12->allow_stream_result = false;
      pSVar12->return_type = CHANGED_ROWS;
      (((tuple<duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_> *)
       &(((Binder *)__return_storage_ptr__)->super_enable_shared_from_this<duckdb::Binder>).
        __weak_this_.internal.super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
      ).super__Head_base<0UL,_duckdb::LogicalOperator_*,_false> =
           (_Head_base<0UL,_duckdb::LogicalOperator_*,_false>)local_258._M_head_impl;
      local_258._M_head_impl = (LogicalDelete *)0x0;
      (((Binder *)__return_storage_ptr__)->super_enable_shared_from_this<duckdb::Binder>).
      __weak_this_.internal.super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               vStack_250.
               super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl
               .super__Vector_impl_data._M_start;
      ((Binder *)__return_storage_ptr__)->context =
           (ClientContext *)
           vStack_250.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      (((Binder *)__return_storage_ptr__)->CTE_bindings)._M_h._M_buckets =
           (__buckets_ptr)
           vStack_250.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
      vStack_250.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      vStack_250.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      vStack_250.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      *(undefined4 *)&(((Binder *)__return_storage_ptr__)->CTE_bindings)._M_h._M_bucket_count =
           local_238._M_t.
           super__Tuple_impl<0UL,_duckdb::BoundTableRef_*,_std::default_delete<duckdb::BoundTableRef>_>
           .super__Head_base<0UL,_duckdb::BoundTableRef_*,_false>._M_head_impl._0_4_;
      *(undefined4 *)
       ((long)&(((Binder *)__return_storage_ptr__)->CTE_bindings)._M_h._M_bucket_count + 4) =
           local_238._M_t.
           super__Tuple_impl<0UL,_duckdb::BoundTableRef_*,_std::default_delete<duckdb::BoundTableRef>_>
           .super__Head_base<0UL,_duckdb::BoundTableRef_*,_false>._M_head_impl._4_4_;
      *(float *)&(((Binder *)__return_storage_ptr__)->CTE_bindings)._M_h._M_before_begin._M_nxt =
           pBStack_230._0_4_;
      *(undefined4 *)
       ((long)&(((Binder *)__return_storage_ptr__)->CTE_bindings)._M_h._M_before_begin._M_nxt + 4) =
           pBStack_230._4_4_;
      (((Binder *)__return_storage_ptr__)->CTE_bindings)._M_h._M_element_count =
           (size_type)local_228._M_nxt;
      local_228._M_nxt = (_Hash_node_base *)0x0;
      local_238._M_t.
      super__Tuple_impl<0UL,_duckdb::BoundTableRef_*,_std::default_delete<duckdb::BoundTableRef>_>.
      super__Head_base<0UL,_duckdb::BoundTableRef_*,_false>._M_head_impl =
           (tuple<duckdb::BoundTableRef_*,_std::default_delete<duckdb::BoundTableRef>_>)
           (_Tuple_impl<0UL,_duckdb::BoundTableRef_*,_std::default_delete<duckdb::BoundTableRef>_>)
           0x0;
      pBStack_230 = (Binder *)0x0;
    }
    else {
      pLVar15 = unique_ptr<duckdb::LogicalDelete,_std::default_delete<duckdb::LogicalDelete>,_true>
                ::operator->(&del);
      pLVar15->return_chunk = true;
      iVar14 = GenerateTableIndex(this_01.ptr);
      pLVar15 = unique_ptr<duckdb::LogicalDelete,_std::default_delete<duckdb::LogicalDelete>,_true>
                ::operator->(&del);
      tVar2 = del;
      pLVar15->table_index = iVar14;
      del.super_unique_ptr<duckdb::LogicalDelete,_std::default_delete<duckdb::LogicalDelete>_>._M_t.
      super___uniq_ptr_impl<duckdb::LogicalDelete,_std::default_delete<duckdb::LogicalDelete>_>._M_t
      .super__Tuple_impl<0UL,_duckdb::LogicalDelete_*,_std::default_delete<duckdb::LogicalDelete>_>.
      super__Head_base<0UL,_duckdb::LogicalDelete_*,_false>._M_head_impl =
           (unique_ptr<duckdb::LogicalDelete,_std::default_delete<duckdb::LogicalDelete>_>)
           (__uniq_ptr_data<duckdb::LogicalDelete,_std::default_delete<duckdb::LogicalDelete>,_true,_true>
            )0x0;
      local_1d8.
      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)(pBVar13->bind_context).cte_references._M_h._M_element_count;
      local_1d8.
      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           *(pointer *)&(pBVar13->bind_context).cte_references._M_h._M_rehash_policy;
      local_1d8.
      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)(pBVar13->bind_context).cte_references._M_h._M_rehash_policy._M_next_resize;
      (pBVar13->bind_context).cte_references._M_h._M_rehash_policy._M_next_resize = 0;
      (pBVar13->bind_context).cte_references._M_h._M_element_count = 0;
      *(undefined8 *)&(pBVar13->bind_context).cte_references._M_h._M_rehash_policy = 0;
      pTVar16 = unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>::
                operator->((unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>
                            *)local_210._M_nxt);
      local_280._M_t.
      super___uniq_ptr_impl<duckdb::LogicalDelete,_std::default_delete<duckdb::LogicalDelete>_>._M_t
      .super__Tuple_impl<0UL,_duckdb::LogicalDelete_*,_std::default_delete<duckdb::LogicalDelete>_>.
      super__Head_base<0UL,_duckdb::LogicalDelete_*,_false>._M_head_impl =
           (__uniq_ptr_data<duckdb::LogicalDelete,_std::default_delete<duckdb::LogicalDelete>,_true,_true>
            )(__uniq_ptr_data<duckdb::LogicalDelete,_std::default_delete<duckdb::LogicalDelete>,_true,_true>
              )tVar2.
               super_unique_ptr<duckdb::LogicalDelete,_std::default_delete<duckdb::LogicalDelete>_>.
               _M_t.
               super___uniq_ptr_impl<duckdb::LogicalDelete,_std::default_delete<duckdb::LogicalDelete>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::LogicalDelete_*,_std::default_delete<duckdb::LogicalDelete>_>
               .super__Head_base<0UL,_duckdb::LogicalDelete_*,_false>._M_head_impl;
      local_148._M_nxt = (_Hash_node_base *)local_258._M_head_impl;
      local_258._M_head_impl = (LogicalDelete *)0x0;
      local_140._M_allocated_capacity =
           (size_type)
           vStack_250.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
           _M_impl.super__Vector_impl_data._M_start;
      local_140._8_8_ =
           vStack_250.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      local_130._M_p =
           (pointer)vStack_250.
                    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage;
      vStack_250.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      vStack_250.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      vStack_250.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_128._0_8_ =
           local_238._M_t.
           super__Tuple_impl<0UL,_duckdb::BoundTableRef_*,_std::default_delete<duckdb::BoundTableRef>_>
           .super__Head_base<0UL,_duckdb::BoundTableRef_*,_false>._M_head_impl;
      local_128._8_8_ = pBStack_230;
      local_128._16_8_ = local_228._M_nxt;
      local_238._M_t.
      super__Tuple_impl<0UL,_duckdb::BoundTableRef_*,_std::default_delete<duckdb::BoundTableRef>_>.
      super__Head_base<0UL,_duckdb::BoundTableRef_*,_false>._M_head_impl =
           (tuple<duckdb::BoundTableRef_*,_std::default_delete<duckdb::BoundTableRef>_>)
           (_Tuple_impl<0UL,_duckdb::BoundTableRef_*,_std::default_delete<duckdb::BoundTableRef>_>)
           0x0;
      pBStack_230 = (Binder *)0x0;
      local_228._M_nxt = (_Hash_node_base *)0x0;
      result.types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)uStack_308;
      result.plan.
      super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t.
      super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
      .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
           (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
           (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
           &local_148;
      result.types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (pointer)root.
                    super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                    ._M_t.
                    super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                    .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
      result.types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)uStack_2f8;
      result.names.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)del.
                    super_unique_ptr<duckdb::LogicalDelete,_std::default_delete<duckdb::LogicalDelete>_>
                    ._M_t.
                    super___uniq_ptr_impl<duckdb::LogicalDelete,_std::default_delete<duckdb::LogicalDelete>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_duckdb::LogicalDelete_*,_std::default_delete<duckdb::LogicalDelete>_>
                    .super__Head_base<0UL,_duckdb::LogicalDelete_*,_false>._M_head_impl;
      result.names.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (pointer)condition.
                    super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
                    _M_t.
                    super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                    .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
      result.names.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_2e0._M_head_impl;
      BindReturning(__return_storage_ptr__,this_01.ptr,
                    (vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                     *)&local_1d8,(TableCatalogEntry *)table._M_nxt,&pTVar16->alias,iVar14,
                    (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                     )&local_280,result);
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_128);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_140);
      if ((DummyBinding *)local_148._M_nxt != (DummyBinding *)0x0) {
        (*((Binding *)&(local_148._M_nxt)->_M_nxt)->_vptr_Binding[1])();
      }
      local_148._M_nxt = (_Hash_node_base *)0x0;
      if (local_280._M_t.
          super___uniq_ptr_impl<duckdb::LogicalDelete,_std::default_delete<duckdb::LogicalDelete>_>.
          _M_t.
          super__Tuple_impl<0UL,_duckdb::LogicalDelete_*,_std::default_delete<duckdb::LogicalDelete>_>
          .super__Head_base<0UL,_duckdb::LogicalDelete_*,_false>._M_head_impl !=
          (__uniq_ptr_impl<duckdb::LogicalDelete,_std::default_delete<duckdb::LogicalDelete>_>)0x0)
      {
        (**(code **)(*(long *)local_280._M_t.
                              super___uniq_ptr_impl<duckdb::LogicalDelete,_std::default_delete<duckdb::LogicalDelete>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_duckdb::LogicalDelete_*,_std::default_delete<duckdb::LogicalDelete>_>
                              .super__Head_base<0UL,_duckdb::LogicalDelete_*,_false>._M_head_impl +
                    8))();
      }
      local_280._M_t.
      super___uniq_ptr_impl<duckdb::LogicalDelete,_std::default_delete<duckdb::LogicalDelete>_>._M_t
      .super__Tuple_impl<0UL,_duckdb::LogicalDelete_*,_std::default_delete<duckdb::LogicalDelete>_>.
      super__Head_base<0UL,_duckdb::LogicalDelete_*,_false>._M_head_impl =
           (__uniq_ptr_data<duckdb::LogicalDelete,_std::default_delete<duckdb::LogicalDelete>,_true,_true>
            )(__uniq_ptr_impl<duckdb::LogicalDelete,_std::default_delete<duckdb::LogicalDelete>_>)
             0x0;
      ::std::
      vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ::~vector(&local_1d8);
    }
    if (del.super_unique_ptr<duckdb::LogicalDelete,_std::default_delete<duckdb::LogicalDelete>_>.
        _M_t.
        super___uniq_ptr_impl<duckdb::LogicalDelete,_std::default_delete<duckdb::LogicalDelete>_>.
        _M_t.
        super__Tuple_impl<0UL,_duckdb::LogicalDelete_*,_std::default_delete<duckdb::LogicalDelete>_>
        .super__Head_base<0UL,_duckdb::LogicalDelete_*,_false>._M_head_impl !=
        (__uniq_ptr_data<duckdb::LogicalDelete,_std::default_delete<duckdb::LogicalDelete>,_true,_true>
         )0x0) {
      (**(code **)(*(long *)del.
                            super_unique_ptr<duckdb::LogicalDelete,_std::default_delete<duckdb::LogicalDelete>_>
                            ._M_t.
                            super___uniq_ptr_impl<duckdb::LogicalDelete,_std::default_delete<duckdb::LogicalDelete>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_duckdb::LogicalDelete_*,_std::default_delete<duckdb::LogicalDelete>_>
                            .super__Head_base<0UL,_duckdb::LogicalDelete_*,_false>._M_head_impl + 8)
      )();
    }
    if (condition.super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
        _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
        _M_t.super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
        super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl !=
        (__uniq_ptr_data<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true,_true>)
        0x0) {
      (**(code **)(*(long *)condition.
                            super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                            ._M_t.
                            super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                            .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl + 8))()
      ;
    }
    if (root.
        super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
        _M_t.
        super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
        .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl !=
        (__uniq_ptr_data<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true,_true>
         )0x0) {
      (**(code **)(*(long *)root.
                            super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                            ._M_t.
                            super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                            .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl +
                  8))();
    }
    if (bound_table.
        super_unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_>._M_t.
        super___uniq_ptr_impl<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_>.
        _M_t.
        super__Tuple_impl<0UL,_duckdb::BoundTableRef_*,_std::default_delete<duckdb::BoundTableRef>_>
        .super__Head_base<0UL,_duckdb::BoundTableRef_*,_false>._M_head_impl !=
        (__uniq_ptr_data<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true,_true>
         )0x0) {
      (**(code **)(*(long *)bound_table.
                            super_unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_>
                            ._M_t.
                            super___uniq_ptr_impl<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_duckdb::BoundTableRef_*,_std::default_delete<duckdb::BoundTableRef>_>
                            .super__Head_base<0UL,_duckdb::BoundTableRef_*,_false>._M_head_impl + 8)
      )();
    }
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_238);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&vStack_250);
    if (local_258._M_head_impl != (LogicalDelete *)0x0) {
      (*(code *)(*(_Hash_node_base **)&(local_258._M_head_impl)->super_LogicalOperator)[1]._M_nxt)()
      ;
    }
    return (BoundStatement *)(Binder *)__return_storage_ptr__;
  }
  this_06 = (BinderException *)__cxa_allocate_exception(0x10);
  using_binder.internal.super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_1a8;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&using_binder,"Can only delete from base table!","");
  BinderException::BinderException(this_06,(string *)&using_binder);
  __cxa_throw(this_06,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

BoundStatement Binder::Bind(DeleteStatement &stmt) {
	BoundStatement result;

	// visit the table reference
	auto bound_table = Bind(*stmt.table);
	if (bound_table->type != TableReferenceType::BASE_TABLE) {
		throw BinderException("Can only delete from base table!");
	}
	auto &table_binding = bound_table->Cast<BoundBaseTableRef>();
	auto &table = table_binding.table;

	auto root = CreatePlan(*bound_table);
	auto &get = root->Cast<LogicalGet>();
	D_ASSERT(root->type == LogicalOperatorType::LOGICAL_GET);

	if (!table.temporary) {
		// delete from persistent table: not read only!
		auto &properties = GetStatementProperties();
		properties.RegisterDBModify(table.catalog, context);
	}

	// Add CTEs as bindable
	AddCTEMap(stmt.cte_map);

	// plan any tables from the various using clauses
	if (!stmt.using_clauses.empty()) {
		unique_ptr<LogicalOperator> child_operator;
		for (auto &using_clause : stmt.using_clauses) {
			// bind the using clause
			auto using_binder = Binder::CreateBinder(context, this);
			auto bound_node = using_binder->Bind(*using_clause);
			auto op = CreatePlan(*bound_node);
			if (child_operator) {
				// already bound a child: create a cross product to unify the two
				child_operator = LogicalCrossProduct::Create(std::move(child_operator), std::move(op));
			} else {
				child_operator = std::move(op);
			}
			bind_context.AddContext(std::move(using_binder->bind_context));
		}
		if (child_operator) {
			root = LogicalCrossProduct::Create(std::move(root), std::move(child_operator));
		}
	}

	// project any additional columns required for the condition
	unique_ptr<Expression> condition;
	if (stmt.condition) {
		WhereBinder binder(*this, context);
		condition = binder.Bind(stmt.condition);

		PlanSubqueries(condition, root);
		auto filter = make_uniq<LogicalFilter>(std::move(condition));
		filter->AddChild(std::move(root));
		root = std::move(filter);
	}
	// create the delete node
	auto del = make_uniq<LogicalDelete>(table, GenerateTableIndex());
	del->bound_constraints = BindConstraints(table);
	del->AddChild(std::move(root));

	// bind the row id columns and add them to the projection list
	BindRowIdColumns(table, get, del->expressions);

	if (!stmt.returning_list.empty()) {
		del->return_chunk = true;

		auto update_table_index = GenerateTableIndex();
		del->table_index = update_table_index;

		unique_ptr<LogicalOperator> del_as_logicaloperator = std::move(del);
		return BindReturning(std::move(stmt.returning_list), table, stmt.table->alias, update_table_index,
		                     std::move(del_as_logicaloperator), std::move(result));
	}
	result.plan = std::move(del);
	result.names = {"Count"};
	result.types = {LogicalType::BIGINT};

	auto &properties = GetStatementProperties();
	properties.allow_stream_result = false;
	properties.return_type = StatementReturnType::CHANGED_ROWS;

	return result;
}